

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::eraseItem(QPDFObjectHandle *this,int at)

{
  bool bVar1;
  Array array;
  allocator<char> local_51;
  string local_50;
  Array local_30;
  
  as_array(&local_30,this,strict);
  if (local_30.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ignoring attempt to erase item",&local_51);
    typeWarning(this,"array",&local_50);
  }
  else {
    bVar1 = ::qpdf::Array::erase(&local_30,at);
    if (bVar1) goto LAB_001c1186;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ignoring attempt to erase out of bounds array item",&local_51);
    objectWarning(this,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
LAB_001c1186:
  ::qpdf::Array::~Array(&local_30);
  return;
}

Assistant:

void
QPDFObjectHandle::eraseItem(int at)
{
    if (auto array = as_array(strict)) {
        if (!array.erase(at)) {
            objectWarning("ignoring attempt to erase out of bounds array item");
            QTC::TC("qpdf", "QPDFObjectHandle erase array bounds");
        }
    } else {
        typeWarning("array", "ignoring attempt to erase item");
        QTC::TC("qpdf", "QPDFObjectHandle array ignoring erase item");
    }
}